

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  float *pfVar3;
  GridSOA *pGVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  GridSOA *pGVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  GridSOA *pGVar14;
  size_t sVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  NodeRef *pNVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  GridSOA *pGVar28;
  GridSOA *pGVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  NodeRef *pNVar34;
  NodeRef *pNVar35;
  ulong uVar36;
  float fVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  float fVar57;
  undefined1 auVar42 [16];
  float fVar59;
  float fVar60;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint uVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar61;
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  float fVar78;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar79;
  float fVar80;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar81;
  float fVar82;
  float fVar91;
  float fVar93;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  float fVar97;
  float fVar98;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar107;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar171;
  float fVar172;
  undefined1 auVar169 [16];
  float fVar173;
  undefined1 auVar170 [16];
  float fVar174;
  float fVar175;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar184;
  float fVar185;
  undefined8 local_b38;
  undefined8 local_b08;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  float old_t_1;
  undefined4 uStack_a34;
  undefined8 uStack_a30;
  float old_t;
  undefined1 local_a18 [16];
  Precalculations *local_a08;
  GridSOA *local_a00;
  ulong local_9f8;
  ulong local_9f0;
  undefined8 local_9e8;
  float fStack_9e0;
  float fStack_9dc;
  undefined1 (*local_9d0) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_968;
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined4 local_888;
  undefined4 uStack_884;
  undefined4 uStack_880;
  undefined4 uStack_87c;
  undefined4 local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  uint local_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar117 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar128 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar133 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar147 = fVar117 * 0.99999964;
  fVar155 = fVar128 * 0.99999964;
  fVar138 = fVar133 * 0.99999964;
  fVar117 = fVar117 * 1.0000004;
  fVar128 = fVar128 * 1.0000004;
  fVar133 = fVar133 * 1.0000004;
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar8 = (tray->tnear).field_0.i[k];
  iVar26 = (tray->tfar).field_0.i[k];
  auVar169._4_4_ = iVar26;
  auVar169._0_4_ = iVar26;
  auVar169._8_4_ = iVar26;
  auVar169._12_4_ = iVar26;
  local_9d0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar35 = stack + 1;
  local_a08 = pre;
LAB_0072a8a7:
  pNVar34 = pNVar35;
  pNVar24 = stack;
  if (pNVar34 == pNVar24) {
LAB_0072bfd8:
    return pNVar34 != stack;
  }
  pNVar35 = pNVar34 + -1;
  uVar27 = pNVar34[-1].ptr;
  while ((uVar27 & 8) == 0) {
    pfVar3 = (float *)(uVar27 + 0x20 + uVar33);
    auVar42._0_4_ = (*pfVar3 - fVar5) * fVar147;
    auVar42._4_4_ = (pfVar3[1] - fVar5) * fVar147;
    auVar42._8_4_ = (pfVar3[2] - fVar5) * fVar147;
    auVar42._12_4_ = (pfVar3[3] - fVar5) * fVar147;
    pfVar3 = (float *)(uVar27 + 0x20 + uVar32);
    auVar142._0_4_ = (*pfVar3 - fVar6) * fVar155;
    auVar142._4_4_ = (pfVar3[1] - fVar6) * fVar155;
    auVar142._8_4_ = (pfVar3[2] - fVar6) * fVar155;
    auVar142._12_4_ = (pfVar3[3] - fVar6) * fVar155;
    auVar42 = maxps(auVar42,auVar142);
    pfVar3 = (float *)(uVar27 + 0x20 + uVar36);
    auVar151._0_4_ = (*pfVar3 - fVar7) * fVar138;
    auVar151._4_4_ = (pfVar3[1] - fVar7) * fVar138;
    auVar151._8_4_ = (pfVar3[2] - fVar7) * fVar138;
    auVar151._12_4_ = (pfVar3[3] - fVar7) * fVar138;
    auVar64._4_4_ = iVar8;
    auVar64._0_4_ = iVar8;
    auVar64._8_4_ = iVar8;
    auVar64._12_4_ = iVar8;
    auVar64 = maxps(auVar151,auVar64);
    auVar64 = maxps(auVar42,auVar64);
    pfVar3 = (float *)(uVar27 + 0x20 + (uVar33 ^ 0x10));
    auVar65._0_4_ = (*pfVar3 - fVar5) * fVar117;
    auVar65._4_4_ = (pfVar3[1] - fVar5) * fVar117;
    auVar65._8_4_ = (pfVar3[2] - fVar5) * fVar117;
    auVar65._12_4_ = (pfVar3[3] - fVar5) * fVar117;
    pfVar3 = (float *)(uVar27 + 0x20 + (uVar32 ^ 0x10));
    auVar83._0_4_ = (*pfVar3 - fVar6) * fVar128;
    auVar83._4_4_ = (pfVar3[1] - fVar6) * fVar128;
    auVar83._8_4_ = (pfVar3[2] - fVar6) * fVar128;
    auVar83._12_4_ = (pfVar3[3] - fVar6) * fVar128;
    auVar42 = minps(auVar65,auVar83);
    pfVar3 = (float *)(uVar27 + 0x20 + (uVar36 ^ 0x10));
    auVar84._0_4_ = (*pfVar3 - fVar7) * fVar133;
    auVar84._4_4_ = (pfVar3[1] - fVar7) * fVar133;
    auVar84._8_4_ = (pfVar3[2] - fVar7) * fVar133;
    auVar84._12_4_ = (pfVar3[3] - fVar7) * fVar133;
    auVar85 = minps(auVar84,auVar169);
    auVar42 = minps(auVar42,auVar85);
    auVar85._4_4_ = -(uint)(auVar64._4_4_ <= auVar42._4_4_);
    auVar85._0_4_ = -(uint)(auVar64._0_4_ <= auVar42._0_4_);
    auVar85._8_4_ = -(uint)(auVar64._8_4_ <= auVar42._8_4_);
    auVar85._12_4_ = -(uint)(auVar64._12_4_ <= auVar42._12_4_);
    uVar23 = movmskps((int)pNVar24,auVar85);
    if (uVar23 == 0) goto LAB_0072a8a7;
    uVar23 = uVar23 & 0xff;
    pNVar24 = (NodeRef *)(uVar27 & 0xfffffffffffffff0);
    lVar16 = 0;
    if (uVar23 != 0) {
      for (; (uVar23 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
      }
    }
    uVar27 = pNVar24[lVar16].ptr;
    uVar23 = uVar23 - 1 & uVar23;
    uVar31 = (ulong)uVar23;
    if (uVar23 != 0) {
      do {
        pNVar35->ptr = uVar27;
        pNVar35 = pNVar35 + 1;
        lVar16 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        uVar27 = pNVar24[lVar16].ptr;
        uVar31 = uVar31 - 1 & uVar31;
      } while (uVar31 != 0);
    }
  }
  if (((uint)uVar27 & 0xf) != 8) {
    pGVar29 = (GridSOA *)(uVar27 & 0xfffffffffffffff0);
    sVar15 = *(size_t *)(pGVar29 + (ulong)*(uint *)(pGVar29 + 0x2c) + 0x30);
    (local_a08->super_Precalculations).grid = pGVar29;
    if (sVar15 != 0) {
      pNVar35->ptr = sVar15;
      pNVar35 = pNVar35 + 1;
    }
    goto LAB_0072a8a7;
  }
  pGVar11 = (local_a08->super_Precalculations).grid;
  uVar31 = (ulong)*(uint *)(pGVar11 + 0xc);
  pGVar29 = pGVar11 + (uVar27 >> 4) * 4 + (ulong)*(uint *)(pGVar11 + 0x24);
  pGVar4 = pGVar11 + (uVar27 >> 4) * 4 + (ulong)*(uint *)(pGVar11 + 0x24) + 0x2c;
  fVar91 = *(float *)(pGVar4 + 4);
  pGVar28 = pGVar29 + uVar31 * 4 + 0x2c;
  fVar172 = *(float *)(pGVar28 + 4);
  fVar95 = *(float *)(pGVar4 + 8);
  fVar173 = *(float *)(pGVar28 + 8);
  if (uVar31 == 2) {
    fVar95 = fVar91;
    fVar173 = fVar172;
  }
  uVar27 = (ulong)*(uint *)(pGVar11 + 0x14);
  fVar123 = *(float *)(pGVar29 + uVar27 * 4 + 0x30);
  pGVar14 = pGVar29 + uVar27 * 4 + 0x2c + uVar31 * 4;
  fVar131 = *(float *)(pGVar14 + 4);
  fVar132 = *(float *)(pGVar14 + 8);
  fVar126 = *(float *)(pGVar29 + uVar27 * 4 + 0x34);
  if (uVar31 == 2) {
    fVar132 = fVar131;
    fVar126 = fVar123;
  }
  fVar57 = *(float *)(pGVar29 + uVar27 * 8 + 0x30);
  pGVar1 = pGVar29 + uVar27 * 8 + 0x2c + uVar31 * 4;
  fVar166 = *(float *)(pGVar1 + 4);
  fVar167 = *(float *)(pGVar1 + 8);
  fVar60 = *(float *)(pGVar29 + uVar27 * 8 + 0x34);
  if (uVar31 == 2) {
    fVar167 = fVar166;
    fVar60 = fVar57;
  }
  uVar23 = *(uint *)(pGVar11 + 0x10);
  local_a00 = pGVar29 + uVar27 * 0xc + 0x2c;
  fVar119 = *(float *)(ray + k * 4);
  fVar124 = *(float *)(ray + k * 4 + 0x10);
  fVar82 = *(float *)(ray + k * 4 + 0x20);
  fVar127 = *(float *)(ray + k * 4 + 0x40);
  fVar61 = *(float *)pGVar4 - fVar119;
  fVar78 = *(float *)pGVar28 - fVar119;
  fVar79 = fVar91 - fVar119;
  fVar80 = fVar172 - fVar119;
  fVar156 = *(float *)(pGVar29 + uVar27 * 4 + 0x2c) - fVar124;
  fVar158 = *(float *)pGVar14 - fVar124;
  fVar160 = fVar123 - fVar124;
  fVar162 = fVar131 - fVar124;
  fVar174 = *(float *)(pGVar29 + uVar27 * 8 + 0x2c) - fVar82;
  fVar178 = *(float *)pGVar1 - fVar82;
  fVar180 = fVar57 - fVar82;
  fVar182 = fVar166 - fVar82;
  fVar81 = fVar91 - fVar119;
  fVar91 = fVar91 - fVar119;
  fVar93 = fVar95 - fVar119;
  fVar95 = fVar95 - fVar119;
  fVar118 = fVar123 - fVar124;
  fVar123 = fVar123 - fVar124;
  fVar125 = fVar126 - fVar124;
  fVar126 = fVar126 - fVar124;
  fVar37 = fVar57 - fVar82;
  fVar57 = fVar57 - fVar82;
  fVar59 = fVar60 - fVar82;
  fVar60 = fVar60 - fVar82;
  fVar168 = *(float *)pGVar28 - fVar119;
  fVar171 = fVar172 - fVar119;
  fVar172 = fVar172 - fVar119;
  fVar173 = fVar173 - fVar119;
  fVar129 = *(float *)pGVar14 - fVar124;
  fVar130 = fVar131 - fVar124;
  fVar131 = fVar131 - fVar124;
  fVar132 = fVar132 - fVar124;
  fVar164 = *(float *)pGVar1 - fVar82;
  fVar165 = fVar166 - fVar82;
  fVar166 = fVar166 - fVar82;
  fVar167 = fVar167 - fVar82;
  fVar97 = fVar168 - fVar61;
  fVar101 = fVar171 - fVar78;
  fVar103 = fVar172 - fVar79;
  fVar105 = fVar173 - fVar80;
  fVar82 = fVar129 - fVar156;
  fVar92 = fVar130 - fVar158;
  fVar94 = fVar131 - fVar160;
  fVar96 = fVar132 - fVar162;
  fVar184 = fVar164 - fVar174;
  fVar185 = fVar165 - fVar178;
  fStack_9e0 = fVar166 - fVar180;
  fStack_9dc = fVar167 - fVar182;
  fVar119 = *(float *)(ray + k * 4 + 0x50);
  fVar124 = *(float *)(ray + k * 4 + 0x60);
  fVar139 = fVar61 - fVar81;
  fVar144 = fVar78 - fVar91;
  fVar145 = fVar79 - fVar93;
  fVar146 = fVar80 - fVar95;
  fVar134 = (fVar82 * (fVar164 + fVar174) - (fVar129 + fVar156) * fVar184) * fVar127 +
            ((fVar168 + fVar61) * fVar184 - (fVar164 + fVar174) * fVar97) * fVar119 +
            (fVar97 * (fVar129 + fVar156) - (fVar168 + fVar61) * fVar82) * fVar124;
  fVar135 = (fVar92 * (fVar165 + fVar178) - (fVar130 + fVar158) * fVar185) * fVar127 +
            ((fVar171 + fVar78) * fVar185 - (fVar165 + fVar178) * fVar101) * fVar119 +
            (fVar101 * (fVar130 + fVar158) - (fVar171 + fVar78) * fVar92) * fVar124;
  fVar136 = (fVar94 * (fVar166 + fVar180) - (fVar131 + fVar160) * fStack_9e0) * fVar127 +
            ((fVar172 + fVar79) * fStack_9e0 - (fVar166 + fVar180) * fVar103) * fVar119 +
            (fVar103 * (fVar131 + fVar160) - (fVar172 + fVar79) * fVar94) * fVar124;
  fVar137 = (fVar96 * (fVar167 + fVar182) - (fVar132 + fVar162) * fStack_9dc) * fVar127 +
            ((fVar173 + fVar80) * fStack_9dc - (fVar167 + fVar182) * fVar105) * fVar119 +
            (fVar105 * (fVar132 + fVar162) - (fVar173 + fVar80) * fVar96) * fVar124;
  fVar98 = fVar156 - fVar118;
  fVar102 = fVar158 - fVar123;
  fVar104 = fVar160 - fVar125;
  fVar106 = fVar162 - fVar126;
  fVar107 = fVar174 - fVar37;
  fVar110 = fVar178 - fVar57;
  fVar111 = fVar180 - fVar59;
  fVar112 = fVar182 - fVar60;
  auVar148._0_4_ =
       (fVar98 * (fVar174 + fVar37) - (fVar156 + fVar118) * fVar107) * fVar127 +
       ((fVar61 + fVar81) * fVar107 - (fVar174 + fVar37) * fVar139) * fVar119 +
       (fVar139 * (fVar156 + fVar118) - (fVar61 + fVar81) * fVar98) * fVar124;
  auVar148._4_4_ =
       (fVar102 * (fVar178 + fVar57) - (fVar158 + fVar123) * fVar110) * fVar127 +
       ((fVar78 + fVar91) * fVar110 - (fVar178 + fVar57) * fVar144) * fVar119 +
       (fVar144 * (fVar158 + fVar123) - (fVar78 + fVar91) * fVar102) * fVar124;
  auVar148._8_4_ =
       (fVar104 * (fVar180 + fVar59) - (fVar160 + fVar125) * fVar111) * fVar127 +
       ((fVar79 + fVar93) * fVar111 - (fVar180 + fVar59) * fVar145) * fVar119 +
       (fVar145 * (fVar160 + fVar125) - (fVar79 + fVar93) * fVar104) * fVar124;
  auVar148._12_4_ =
       (fVar106 * (fVar182 + fVar60) - (fVar162 + fVar126) * fVar112) * fVar127 +
       ((fVar80 + fVar95) * fVar112 - (fVar182 + fVar60) * fVar146) * fVar119 +
       (fVar146 * (fVar162 + fVar126) - (fVar80 + fVar95) * fVar106) * fVar124;
  fVar175 = fVar81 - fVar168;
  fVar179 = fVar91 - fVar171;
  fVar181 = fVar93 - fVar172;
  fVar183 = fVar95 - fVar173;
  fVar157 = fVar118 - fVar129;
  fVar159 = fVar123 - fVar130;
  fVar161 = fVar125 - fVar131;
  fVar163 = fVar126 - fVar132;
  fVar113 = fVar37 - fVar164;
  fVar114 = fVar57 - fVar165;
  fVar115 = fVar59 - fVar166;
  fVar116 = fVar60 - fVar167;
  auVar66._0_4_ =
       (fVar157 * (fVar164 + fVar37) - (fVar129 + fVar118) * fVar113) * fVar127 +
       ((fVar168 + fVar81) * fVar113 - (fVar164 + fVar37) * fVar175) * fVar119 +
       (fVar175 * (fVar129 + fVar118) - (fVar168 + fVar81) * fVar157) * fVar124;
  auVar66._4_4_ =
       (fVar159 * (fVar165 + fVar57) - (fVar130 + fVar123) * fVar114) * fVar127 +
       ((fVar171 + fVar91) * fVar114 - (fVar165 + fVar57) * fVar179) * fVar119 +
       (fVar179 * (fVar130 + fVar123) - (fVar171 + fVar91) * fVar159) * fVar124;
  auVar66._8_4_ =
       (fVar161 * (fVar166 + fVar59) - (fVar131 + fVar125) * fVar115) * fVar127 +
       ((fVar172 + fVar93) * fVar115 - (fVar166 + fVar59) * fVar181) * fVar119 +
       (fVar181 * (fVar131 + fVar125) - (fVar172 + fVar93) * fVar161) * fVar124;
  auVar66._12_4_ =
       (fVar163 * (fVar167 + fVar60) - (fVar132 + fVar126) * fVar116) * fVar127 +
       ((fVar173 + fVar95) * fVar116 - (fVar167 + fVar60) * fVar183) * fVar119 +
       (fVar183 * (fVar132 + fVar126) - (fVar173 + fVar95) * fVar163) * fVar124;
  auVar86._0_4_ = fVar134 + auVar148._0_4_ + auVar66._0_4_;
  auVar86._4_4_ = fVar135 + auVar148._4_4_ + auVar66._4_4_;
  auVar86._8_4_ = fVar136 + auVar148._8_4_ + auVar66._8_4_;
  auVar86._12_4_ = fVar137 + auVar148._12_4_ + auVar66._12_4_;
  auVar43._4_4_ = fVar135;
  auVar43._0_4_ = fVar134;
  auVar43._8_4_ = fVar136;
  auVar43._12_4_ = fVar137;
  auVar64 = minps(auVar43,auVar148);
  auVar64 = minps(auVar64,auVar66);
  auVar120._4_4_ = fVar135;
  auVar120._0_4_ = fVar134;
  auVar120._8_4_ = fVar136;
  auVar120._12_4_ = fVar137;
  auVar42 = maxps(auVar120,auVar148);
  auVar42 = maxps(auVar42,auVar66);
  local_7f8 = ABS(auVar86._0_4_);
  fStack_7f4 = ABS(auVar86._4_4_);
  fStack_7f0 = ABS(auVar86._8_4_);
  fStack_7ec = ABS(auVar86._12_4_);
  auVar121._4_4_ = -(uint)(auVar42._4_4_ <= fStack_7f4 * 1.1920929e-07);
  auVar121._0_4_ = -(uint)(auVar42._0_4_ <= local_7f8 * 1.1920929e-07);
  auVar121._8_4_ = -(uint)(auVar42._8_4_ <= fStack_7f0 * 1.1920929e-07);
  auVar121._12_4_ = -(uint)(auVar42._12_4_ <= fStack_7ec * 1.1920929e-07);
  auVar44._4_4_ = -(uint)(-(fStack_7f4 * 1.1920929e-07) <= auVar64._4_4_);
  auVar44._0_4_ = -(uint)(-(local_7f8 * 1.1920929e-07) <= auVar64._0_4_);
  auVar44._8_4_ = -(uint)(-(fStack_7f0 * 1.1920929e-07) <= auVar64._8_4_);
  auVar44._12_4_ = -(uint)(-(fStack_7ec * 1.1920929e-07) <= auVar64._12_4_);
  auVar121 = auVar121 | auVar44;
  iVar26 = movmskps((int)local_a00,auVar121);
  if (iVar26 == 0) {
LAB_0072b464:
    if (uVar23 < 3) goto LAB_0072a8a7;
    pGVar28 = pGVar29 + uVar31 * 4 + 0x2c;
    fVar91 = *(float *)(pGVar29 + uVar31 * 4 + 0x30);
    pGVar4 = pGVar28 + uVar31 * 4;
    fVar172 = *(float *)(pGVar4 + 4);
    fVar95 = *(float *)(pGVar29 + uVar31 * 4 + 0x34);
    fVar173 = *(float *)(pGVar4 + 8);
    if (uVar31 == 2) {
      fVar95 = fVar91;
      fVar173 = fVar172;
    }
    pGVar14 = (local_a08->super_Precalculations).grid;
    uVar27 = (ulong)*(uint *)(pGVar14 + 0x14);
    pGVar29 = pGVar28 + uVar27 * 4;
    fVar123 = *(float *)(pGVar29 + 4);
    pGVar11 = pGVar29 + uVar31 * 4;
    fVar131 = *(float *)(pGVar11 + 4);
    fVar132 = *(float *)(pGVar11 + 8);
    fVar126 = *(float *)(pGVar29 + 8);
    if (uVar31 == 2) {
      fVar132 = fVar131;
      fVar126 = fVar123;
    }
    pGVar1 = pGVar28 + uVar27 * 8;
    fVar57 = *(float *)(pGVar1 + 4);
    pGVar2 = pGVar1 + uVar31 * 4;
    fVar166 = *(float *)(pGVar2 + 4);
    fVar167 = *(float *)(pGVar2 + 8);
    fVar60 = *(float *)(pGVar1 + 8);
    if (uVar31 == 2) {
      fVar167 = fVar166;
      fVar60 = fVar57;
    }
    local_a00 = pGVar28 + uVar27 * 0xc;
    fVar119 = *(float *)(ray + k * 4);
    fVar124 = *(float *)(ray + k * 4 + 0x10);
    fVar82 = *(float *)(ray + k * 4 + 0x20);
    fVar127 = *(float *)(ray + k * 4 + 0x40);
    fVar107 = *(float *)pGVar28 - fVar119;
    fVar111 = *(float *)pGVar4 - fVar119;
    fVar113 = fVar91 - fVar119;
    fVar115 = fVar172 - fVar119;
    fVar178 = *(float *)pGVar29 - fVar124;
    fVar180 = *(float *)pGVar11 - fVar124;
    fStack_9e0 = fVar123 - fVar124;
    fStack_9dc = fVar131 - fVar124;
    local_9e8 = (GridSOA *)CONCAT44(fVar180,fVar178);
    fVar61 = *(float *)pGVar1 - fVar82;
    fVar78 = *(float *)pGVar2 - fVar82;
    fVar79 = fVar57 - fVar82;
    fVar80 = fVar166 - fVar82;
    fVar81 = fVar91 - fVar119;
    fVar91 = fVar91 - fVar119;
    fVar93 = fVar95 - fVar119;
    fVar95 = fVar95 - fVar119;
    fVar134 = fVar123 - fVar124;
    fVar123 = fVar123 - fVar124;
    fVar135 = fVar126 - fVar124;
    fVar126 = fVar126 - fVar124;
    fVar156 = fVar57 - fVar82;
    fVar57 = fVar57 - fVar82;
    fVar157 = fVar60 - fVar82;
    fVar60 = fVar60 - fVar82;
    fVar37 = *(float *)pGVar4 - fVar119;
    fVar59 = fVar172 - fVar119;
    fVar172 = fVar172 - fVar119;
    fVar173 = fVar173 - fVar119;
    fVar136 = *(float *)pGVar11 - fVar124;
    fVar137 = fVar131 - fVar124;
    fVar131 = fVar131 - fVar124;
    fVar132 = fVar132 - fVar124;
    fVar184 = *(float *)pGVar2 - fVar82;
    fVar185 = fVar166 - fVar82;
    fVar166 = fVar166 - fVar82;
    fVar167 = fVar167 - fVar82;
    fVar97 = fVar37 - fVar107;
    fVar101 = fVar59 - fVar111;
    fVar103 = fVar172 - fVar113;
    fVar105 = fVar173 - fVar115;
    fVar82 = fVar136 - fVar178;
    fVar92 = fVar137 - fVar180;
    fVar94 = fVar131 - fStack_9e0;
    fVar96 = fVar132 - fStack_9dc;
    fVar162 = fVar184 - fVar61;
    fVar163 = fVar185 - fVar78;
    fVar164 = fVar166 - fVar79;
    fVar165 = fVar167 - fVar80;
    fVar119 = *(float *)(ray + k * 4 + 0x50);
    fVar124 = *(float *)(ray + k * 4 + 0x60);
    fVar98 = fVar107 - fVar81;
    fVar102 = fVar111 - fVar91;
    fVar104 = fVar113 - fVar93;
    fVar106 = fVar115 - fVar95;
    fVar139 = (fVar82 * (fVar184 + fVar61) - (fVar136 + fVar178) * fVar162) * fVar127 +
              ((fVar37 + fVar107) * fVar162 - (fVar184 + fVar61) * fVar97) * fVar119 +
              (fVar97 * (fVar136 + fVar178) - (fVar37 + fVar107) * fVar82) * fVar124;
    fVar144 = (fVar92 * (fVar185 + fVar78) - (fVar137 + fVar180) * fVar163) * fVar127 +
              ((fVar59 + fVar111) * fVar163 - (fVar185 + fVar78) * fVar101) * fVar119 +
              (fVar101 * (fVar137 + fVar180) - (fVar59 + fVar111) * fVar92) * fVar124;
    fVar145 = (fVar94 * (fVar166 + fVar79) - (fVar131 + fStack_9e0) * fVar164) * fVar127 +
              ((fVar172 + fVar113) * fVar164 - (fVar166 + fVar79) * fVar103) * fVar119 +
              (fVar103 * (fVar131 + fStack_9e0) - (fVar172 + fVar113) * fVar94) * fVar124;
    fVar146 = (fVar96 * (fVar167 + fVar80) - (fVar132 + fStack_9dc) * fVar165) * fVar127 +
              ((fVar173 + fVar115) * fVar165 - (fVar167 + fVar80) * fVar105) * fVar119 +
              (fVar105 * (fVar132 + fStack_9dc) - (fVar173 + fVar115) * fVar96) * fVar124;
    fVar168 = fVar178 - fVar134;
    fVar171 = fVar180 - fVar123;
    fVar174 = fStack_9e0 - fVar135;
    fVar175 = fStack_9dc - fVar126;
    fVar110 = fVar61 - fVar156;
    fVar112 = fVar78 - fVar57;
    fVar114 = fVar79 - fVar157;
    fVar116 = fVar80 - fVar60;
    auVar152._0_4_ =
         (fVar168 * (fVar61 + fVar156) - (fVar178 + fVar134) * fVar110) * fVar127 +
         ((fVar107 + fVar81) * fVar110 - (fVar61 + fVar156) * fVar98) * fVar119 +
         (fVar98 * (fVar178 + fVar134) - (fVar107 + fVar81) * fVar168) * fVar124;
    auVar152._4_4_ =
         (fVar171 * (fVar78 + fVar57) - (fVar180 + fVar123) * fVar112) * fVar127 +
         ((fVar111 + fVar91) * fVar112 - (fVar78 + fVar57) * fVar102) * fVar119 +
         (fVar102 * (fVar180 + fVar123) - (fVar111 + fVar91) * fVar171) * fVar124;
    auVar152._8_4_ =
         (fVar174 * (fVar79 + fVar157) - (fStack_9e0 + fVar135) * fVar114) * fVar127 +
         ((fVar113 + fVar93) * fVar114 - (fVar79 + fVar157) * fVar104) * fVar119 +
         (fVar104 * (fStack_9e0 + fVar135) - (fVar113 + fVar93) * fVar174) * fVar124;
    auVar152._12_4_ =
         (fVar175 * (fVar80 + fVar60) - (fStack_9dc + fVar126) * fVar116) * fVar127 +
         ((fVar115 + fVar95) * fVar116 - (fVar80 + fVar60) * fVar106) * fVar119 +
         (fVar106 * (fStack_9dc + fVar126) - (fVar115 + fVar95) * fVar175) * fVar124;
    fVar179 = fVar81 - fVar37;
    fVar181 = fVar91 - fVar59;
    fVar182 = fVar93 - fVar172;
    fVar183 = fVar95 - fVar173;
    fVar158 = fVar134 - fVar136;
    fVar159 = fVar123 - fVar137;
    fVar160 = fVar135 - fVar131;
    fVar161 = fVar126 - fVar132;
    fVar118 = fVar156 - fVar184;
    fVar125 = fVar57 - fVar185;
    fVar129 = fVar157 - fVar166;
    fVar130 = fVar60 - fVar167;
    auVar72._0_4_ =
         (fVar158 * (fVar184 + fVar156) - (fVar136 + fVar134) * fVar118) * fVar127 +
         ((fVar37 + fVar81) * fVar118 - (fVar184 + fVar156) * fVar179) * fVar119 +
         (fVar179 * (fVar136 + fVar134) - (fVar37 + fVar81) * fVar158) * fVar124;
    auVar72._4_4_ =
         (fVar159 * (fVar185 + fVar57) - (fVar137 + fVar123) * fVar125) * fVar127 +
         ((fVar59 + fVar91) * fVar125 - (fVar185 + fVar57) * fVar181) * fVar119 +
         (fVar181 * (fVar137 + fVar123) - (fVar59 + fVar91) * fVar159) * fVar124;
    auVar72._8_4_ =
         (fVar160 * (fVar166 + fVar157) - (fVar131 + fVar135) * fVar129) * fVar127 +
         ((fVar172 + fVar93) * fVar129 - (fVar166 + fVar157) * fVar182) * fVar119 +
         (fVar182 * (fVar131 + fVar135) - (fVar172 + fVar93) * fVar160) * fVar124;
    auVar72._12_4_ =
         (fVar161 * (fVar167 + fVar60) - (fVar132 + fVar126) * fVar130) * fVar127 +
         ((fVar173 + fVar95) * fVar130 - (fVar167 + fVar60) * fVar183) * fVar119 +
         (fVar183 * (fVar132 + fVar126) - (fVar173 + fVar95) * fVar161) * fVar124;
    fVar95 = fVar139 + auVar152._0_4_ + auVar72._0_4_;
    fVar173 = fVar144 + auVar152._4_4_ + auVar72._4_4_;
    fVar123 = fVar145 + auVar152._8_4_ + auVar72._8_4_;
    fVar131 = fVar146 + auVar152._12_4_ + auVar72._12_4_;
    auVar50._4_4_ = fVar144;
    auVar50._0_4_ = fVar139;
    auVar50._8_4_ = fVar145;
    auVar50._12_4_ = fVar146;
    auVar64 = minps(auVar50,auVar152);
    auVar64 = minps(auVar64,auVar72);
    auVar108._4_4_ = fVar144;
    auVar108._0_4_ = fVar139;
    auVar108._8_4_ = fVar145;
    auVar108._12_4_ = fVar146;
    auVar42 = maxps(auVar108,auVar152);
    auVar42 = maxps(auVar42,auVar72);
    local_968 = CONCAT44(fVar173,fVar95) & 0x7fffffff7fffffff;
    fVar91 = ABS(fVar123) * 1.1920929e-07;
    fVar172 = ABS(fVar131) * 1.1920929e-07;
    auVar109._4_4_ = -(uint)(auVar42._4_4_ <= ABS(fVar173) * 1.1920929e-07);
    auVar109._0_4_ = -(uint)(auVar42._0_4_ <= ABS(fVar95) * 1.1920929e-07);
    auVar109._8_4_ = -(uint)(auVar42._8_4_ <= fVar91);
    auVar109._12_4_ = -(uint)(auVar42._12_4_ <= fVar172);
    auVar51._4_4_ = -(uint)(-(ABS(fVar173) * 1.1920929e-07) <= auVar64._4_4_);
    auVar51._0_4_ = -(uint)(-(ABS(fVar95) * 1.1920929e-07) <= auVar64._0_4_);
    auVar51._8_4_ = -(uint)(-fVar91 <= auVar64._8_4_);
    auVar51._12_4_ = -(uint)(-fVar172 <= auVar64._12_4_);
    auVar109 = auVar109 | auVar51;
    iVar26 = movmskps((int)local_a00,auVar109);
    if (iVar26 == 0) goto LAB_0072a8a7;
    auVar170._0_4_ = fVar168 * fVar118 - fVar158 * fVar110;
    auVar170._4_4_ = fVar171 * fVar125 - fVar159 * fVar112;
    auVar170._8_4_ = fVar174 * fVar129 - fVar160 * fVar114;
    auVar170._12_4_ = fVar175 * fVar130 - fVar161 * fVar116;
    auVar52._4_4_ = -(uint)(ABS(fVar171 * fVar163) < ABS(fVar159 * fVar112));
    auVar52._0_4_ = -(uint)(ABS(fVar168 * fVar162) < ABS(fVar158 * fVar110));
    auVar52._8_4_ = -(uint)(ABS(fVar174 * fVar164) < ABS(fVar160 * fVar114));
    auVar52._12_4_ = -(uint)(ABS(fVar175 * fVar165) < ABS(fVar161 * fVar116));
    auVar22._4_4_ = fVar173;
    auVar22._0_4_ = fVar95;
    auVar22._8_4_ = fVar123;
    auVar22._12_4_ = fVar131;
    auVar20._4_4_ = fVar92 * fVar112 - fVar171 * fVar163;
    auVar20._0_4_ = fVar82 * fVar110 - fVar168 * fVar162;
    auVar20._8_4_ = fVar94 * fVar114 - fVar174 * fVar164;
    auVar20._12_4_ = fVar96 * fVar116 - fVar175 * fVar165;
    local_8b8 = blendvps(auVar170,auVar20,auVar52);
    auVar153._0_4_ = fVar162 * fVar98 - fVar97 * fVar110;
    auVar153._4_4_ = fVar163 * fVar102 - fVar101 * fVar112;
    auVar153._8_4_ = fVar164 * fVar104 - fVar103 * fVar114;
    auVar153._12_4_ = fVar165 * fVar106 - fVar105 * fVar116;
    auVar177._0_4_ = fVar179 * fVar110 - fVar98 * fVar118;
    auVar177._4_4_ = fVar181 * fVar112 - fVar102 * fVar125;
    auVar177._8_4_ = fVar182 * fVar114 - fVar104 * fVar129;
    auVar177._12_4_ = fVar183 * fVar116 - fVar106 * fVar130;
    auVar53._4_4_ = -(uint)(ABS(fVar101 * fVar112) < ABS(fVar102 * fVar125));
    auVar53._0_4_ = -(uint)(ABS(fVar97 * fVar110) < ABS(fVar98 * fVar118));
    auVar53._8_4_ = -(uint)(ABS(fVar103 * fVar114) < ABS(fVar104 * fVar129));
    auVar53._12_4_ = -(uint)(ABS(fVar105 * fVar116) < ABS(fVar106 * fVar130));
    local_8a8 = blendvps(auVar177,auVar153,auVar53);
    auVar122._0_4_ = fVar97 * fVar168 - fVar98 * fVar82;
    auVar122._4_4_ = fVar101 * fVar171 - fVar102 * fVar92;
    auVar122._8_4_ = fVar103 * fVar174 - fVar104 * fVar94;
    auVar122._12_4_ = fVar105 * fVar175 - fVar106 * fVar96;
    auVar100._0_4_ = fVar98 * fVar158 - fVar179 * fVar168;
    auVar100._4_4_ = fVar102 * fVar159 - fVar181 * fVar171;
    auVar100._8_4_ = fVar104 * fVar160 - fVar182 * fVar174;
    auVar100._12_4_ = fVar106 * fVar161 - fVar183 * fVar175;
    auVar54._4_4_ = -(uint)(ABS(fVar102 * fVar92) < ABS(fVar181 * fVar171));
    auVar54._0_4_ = -(uint)(ABS(fVar98 * fVar82) < ABS(fVar179 * fVar168));
    auVar54._8_4_ = -(uint)(ABS(fVar104 * fVar94) < ABS(fVar182 * fVar174));
    auVar54._12_4_ = -(uint)(ABS(fVar106 * fVar96) < ABS(fVar183 * fVar175));
    local_898 = blendvps(auVar100,auVar122,auVar54);
    fVar57 = fVar127 * local_8b8._0_4_ + fVar119 * local_8a8._0_4_ + fVar124 * local_898._0_4_;
    fVar166 = fVar127 * local_8b8._4_4_ + fVar119 * local_8a8._4_4_ + fVar124 * local_898._4_4_;
    fVar167 = fVar127 * local_8b8._8_4_ + fVar119 * local_8a8._8_4_ + fVar124 * local_898._8_4_;
    fVar60 = fVar127 * local_8b8._12_4_ + fVar119 * local_8a8._12_4_ + fVar124 * local_898._12_4_;
    fVar57 = fVar57 + fVar57;
    fVar166 = fVar166 + fVar166;
    fVar167 = fVar167 + fVar167;
    fVar60 = fVar60 + fVar60;
    auVar73._0_4_ = fVar178 * local_8a8._0_4_ + fVar61 * local_898._0_4_;
    auVar73._4_4_ = fVar180 * local_8a8._4_4_ + fVar78 * local_898._4_4_;
    auVar73._8_4_ = fStack_9e0 * local_8a8._8_4_ + fVar79 * local_898._8_4_;
    auVar73._12_4_ = fStack_9dc * local_8a8._12_4_ + fVar80 * local_898._12_4_;
    fVar119 = fVar107 * local_8b8._0_4_ + auVar73._0_4_;
    fVar124 = fVar111 * local_8b8._4_4_ + auVar73._4_4_;
    fVar82 = fVar113 * local_8b8._8_4_ + auVar73._8_4_;
    fVar127 = fVar115 * local_8b8._12_4_ + auVar73._12_4_;
    auVar17._4_4_ = fVar166;
    auVar17._0_4_ = fVar57;
    auVar17._8_4_ = fVar167;
    auVar17._12_4_ = fVar60;
    auVar64 = rcpps(auVar73,auVar17);
    fVar91 = auVar64._0_4_;
    fVar172 = auVar64._4_4_;
    fVar132 = auVar64._8_4_;
    fVar126 = auVar64._12_4_;
    local_8c8._0_4_ = ((1.0 - fVar57 * fVar91) * fVar91 + fVar91) * (fVar119 + fVar119);
    local_8c8._4_4_ = ((1.0 - fVar166 * fVar172) * fVar172 + fVar172) * (fVar124 + fVar124);
    local_8c8._8_4_ = ((1.0 - fVar167 * fVar132) * fVar132 + fVar132) * (fVar82 + fVar82);
    local_8c8._12_4_ = ((1.0 - fVar60 * fVar126) * fVar126 + fVar126) * (fVar127 + fVar127);
    fVar91 = *(float *)(ray + k * 4 + 0x80);
    fVar172 = *(float *)(ray + k * 4 + 0x30);
    auVar74._0_4_ =
         -(uint)(local_8c8._0_4_ <= fVar91 && fVar172 <= local_8c8._0_4_) & auVar109._0_4_;
    auVar74._4_4_ =
         -(uint)(local_8c8._4_4_ <= fVar91 && fVar172 <= local_8c8._4_4_) & auVar109._4_4_;
    auVar74._8_4_ =
         -(uint)(local_8c8._8_4_ <= fVar91 && fVar172 <= local_8c8._8_4_) & auVar109._8_4_;
    auVar74._12_4_ =
         -(uint)(local_8c8._12_4_ <= fVar91 && fVar172 <= local_8c8._12_4_) & auVar109._12_4_;
    iVar26 = movmskps(iVar26,auVar74);
    if ((iVar26 == 0) ||
       (auVar75._0_4_ = auVar74._0_4_ & -(uint)(fVar57 != 0.0),
       auVar75._4_4_ = auVar74._4_4_ & -(uint)(fVar166 != 0.0),
       auVar75._8_4_ = auVar74._8_4_ & -(uint)(fVar167 != 0.0),
       auVar75._12_4_ = auVar74._12_4_ & -(uint)(fVar60 != 0.0),
       uVar30 = movmskps(*(uint *)(pGVar14 + 0x14) * 0xc,auVar75), uVar30 == 0)) goto LAB_0072a8a7;
    uVar38 = *(uint *)(pGVar14 + 0x18);
    uVar9 = *(undefined4 *)(pGVar14 + 0x1c);
    pGVar12 = (context->scene->geometries).items[uVar38].ptr;
    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0072a8a7;
    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
       (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
      auVar64 = *(undefined1 (*) [16])local_a00;
      auVar63 = auVar64._0_12_;
      auVar42 = *(undefined1 (*) [16])(local_a00 + uVar31 * 4);
      auVar41 = auVar42._0_12_;
      if (uVar31 == 2) {
        auVar63._0_8_ = auVar64._0_8_;
        auVar63._8_4_ = auVar64._4_4_;
        auVar41._0_8_ = auVar42._0_8_;
        auVar41._8_4_ = auVar42._4_4_;
      }
      auVar64 = rcpps(auVar152,auVar22);
      fVar172 = auVar64._0_4_;
      fVar132 = auVar64._4_4_;
      fVar126 = auVar64._8_4_;
      fVar57 = auVar64._12_4_;
      fVar172 = (float)(-(uint)(1e-18 <= (float)local_968) &
                       (uint)(((float)DAT_01f46a60 - fVar95 * fVar172) * fVar172 + fVar172));
      fVar95 = (float)(-(uint)(1e-18 <= local_968._4_4_) &
                      (uint)((DAT_01f46a60._4_4_ - fVar173 * fVar132) * fVar132 + fVar132));
      fVar173 = (float)(-(uint)(1e-18 <= ABS(fVar123)) &
                       (uint)((DAT_01f46a60._8_4_ - fVar123 * fVar126) * fVar126 + fVar126));
      fVar123 = (float)(-(uint)(1e-18 <= ABS(fVar131)) &
                       (uint)((DAT_01f46a60._12_4_ - fVar131 * fVar57) * fVar57 + fVar57));
      auVar143._0_4_ = fVar139 * fVar172;
      auVar143._4_4_ = fVar144 * fVar95;
      auVar143._8_4_ = fVar145 * fVar173;
      auVar143._12_4_ = fVar146 * fVar123;
      auVar142 = minps(auVar143,_DAT_01f46a60);
      auVar154._0_4_ = auVar152._0_4_ * fVar172;
      auVar154._4_4_ = auVar152._4_4_ * fVar95;
      auVar154._8_4_ = auVar152._8_4_ * fVar173;
      auVar154._12_4_ = auVar152._12_4_ * fVar123;
      auVar151 = minps(auVar154,_DAT_01f46a60);
      auVar76._4_4_ = auVar63._4_4_;
      auVar90._0_8_ = auVar63._0_8_;
      auVar76._8_4_ = auVar63._8_4_;
      auVar90._8_4_ = auVar76._4_4_;
      uVar58 = auVar41._4_4_;
      auVar90._12_4_ = uVar58;
      uVar39 = auVar41._0_4_;
      auVar89._8_8_ = auVar90._8_8_;
      auVar89._0_4_ = auVar63._0_4_;
      auVar89._4_4_ = uVar39;
      auVar76._0_4_ = auVar76._4_4_;
      auVar76._12_4_ = auVar76._8_4_;
      auVar55._0_8_ = auVar41._0_8_;
      auVar55._8_4_ = uVar58;
      auVar55._12_4_ = auVar41._8_4_;
      auVar85 = pblendw(auVar89,ZEXT816(0),0xaa);
      auVar42 = pblendw(auVar76,ZEXT816(0),0xaa);
      auVar64 = pblendw(auVar55,ZEXT816(0),0xaa);
      fVar131 = auVar142._0_4_;
      fVar132 = auVar142._4_4_;
      fVar126 = auVar142._8_4_;
      fVar57 = auVar142._12_4_;
      fVar166 = auVar151._0_4_;
      fVar167 = auVar151._4_4_;
      fVar60 = auVar151._8_4_;
      fVar119 = auVar151._12_4_;
      fVar172 = ((float)DAT_01f46a60 - fVar131) - fVar166;
      fVar95 = (DAT_01f46a60._4_4_ - fVar132) - fVar167;
      fVar173 = (DAT_01f46a60._8_4_ - fVar126) - fVar60;
      fVar123 = (DAT_01f46a60._12_4_ - fVar57) - fVar119;
      local_8e8._0_4_ =
           (float)auVar85._0_4_ * 0.00012207031 * fVar172 +
           (float)auVar64._0_4_ * 0.00012207031 * fVar166 +
           (float)auVar42._0_4_ * 0.00012207031 * fVar131;
      local_8e8._4_4_ =
           (float)auVar85._4_4_ * 0.00012207031 * fVar95 +
           (float)auVar64._4_4_ * 0.00012207031 * fVar167 +
           (float)auVar42._4_4_ * 0.00012207031 * fVar132;
      local_8e8._8_4_ =
           (float)auVar85._8_4_ * 0.00012207031 * fVar173 +
           (float)auVar64._8_4_ * 0.00012207031 * fVar60 +
           (float)auVar42._8_4_ * 0.00012207031 * fVar126;
      local_8e8._12_4_ =
           (float)auVar85._12_4_ * 0.00012207031 * fVar123 +
           (float)auVar64._12_4_ * 0.00012207031 * fVar119 +
           (float)auVar42._12_4_ * 0.00012207031 * fVar57;
      local_8d8._0_4_ =
           fVar172 * (float)(auVar89._0_4_ >> 0x10) * 0.00012207031 +
           (float)(uVar39 >> 0x10) * 0.00012207031 * fVar166 +
           (float)(auVar76._4_4_ >> 0x10) * 0.00012207031 * fVar131;
      local_8d8._4_4_ =
           fVar95 * (float)(uVar39 >> 0x10) * 0.00012207031 +
           (float)(uVar58 >> 0x10) * 0.00012207031 * fVar167 +
           (float)(auVar76._4_4_ >> 0x10) * 0.00012207031 * fVar132;
      local_8d8._8_4_ =
           fVar173 * (float)(auVar76._4_4_ >> 0x10) * 0.00012207031 +
           (float)(uVar58 >> 0x10) * 0.00012207031 * fVar60 +
           (float)(auVar76._8_4_ >> 0x10) * 0.00012207031 * fVar126;
      local_8d8._12_4_ =
           fVar123 * (float)(uVar58 >> 0x10) * 0.00012207031 +
           (float)(auVar41._8_4_ >> 0x10) * 0.00012207031 * fVar119 +
           (float)(auVar76._8_4_ >> 0x10) * 0.00012207031 * fVar57;
      uVar25 = (ulong)(uVar30 & 0xff);
      uVar27 = 0;
      if (uVar25 != 0) {
        for (; ((uVar30 & 0xff) >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      local_b38 = CONCAT44(uVar38,uVar38);
      local_b08 = CONCAT44(uVar9,uVar9);
      auVar64 = *local_9d0;
      local_9f8 = uVar31;
      local_9f0 = (ulong)uVar23;
      while (uVar25 != 0) {
        local_858 = *(undefined4 *)(local_8e8 + uVar27 * 4);
        uVar10 = *(undefined4 *)(local_8d8 + uVar27 * 4);
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8c8 + uVar27 * 4);
        args.context = context->user;
        local_848._4_4_ = uVar10;
        local_848._0_4_ = uVar10;
        local_848._8_4_ = uVar10;
        local_848._12_4_ = uVar10;
        local_888 = *(undefined4 *)(local_8b8 + uVar27 * 4);
        local_878 = *(undefined4 *)(local_8a8 + uVar27 * 4);
        local_868 = *(undefined4 *)(local_898 + uVar27 * 4);
        uStack_884 = local_888;
        uStack_880 = local_888;
        uStack_87c = local_888;
        uStack_874 = local_878;
        uStack_870 = local_878;
        uStack_86c = local_878;
        uStack_864 = local_868;
        uStack_860 = local_868;
        uStack_85c = local_868;
        uStack_854 = local_858;
        uStack_850 = local_858;
        uStack_84c = local_858;
        local_838 = local_b08;
        uStack_830 = CONCAT44(uVar9,uVar9);
        local_828 = local_b38;
        uStack_820 = CONCAT44(uVar38,uVar38);
        local_818 = (args.context)->instID[0];
        uStack_814 = local_818;
        uStack_810 = local_818;
        uStack_80c = local_818;
        local_808 = (args.context)->instPrimID[0];
        uStack_804 = local_808;
        uStack_800 = local_808;
        uStack_7fc = local_808;
        args.valid = (int *)local_a18;
        args.geometryUserPtr = pGVar12->userPtr;
        args.hit = (RTCHitN *)&local_888;
        args.N = 4;
        local_a18 = auVar64;
        args.ray = (RTCRayN *)ray;
        if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
          (*pGVar12->occlusionFilterN)(&args);
        }
        if (local_a18 == (undefined1  [16])0x0) {
          auVar77._8_4_ = 0xffffffff;
          auVar77._0_8_ = 0xffffffffffffffff;
          auVar77._12_4_ = 0xffffffff;
          auVar77 = auVar77 ^ _DAT_01f46b70;
        }
        else {
          p_Var13 = context->args->filter;
          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
            (*p_Var13)(&args);
          }
          auVar56._0_4_ = -(uint)(local_a18._0_4_ == 0);
          auVar56._4_4_ = -(uint)(local_a18._4_4_ == 0);
          auVar56._8_4_ = -(uint)(local_a18._8_4_ == 0);
          auVar56._12_4_ = -(uint)(local_a18._12_4_ == 0);
          auVar77 = auVar56 ^ _DAT_01f46b70;
          auVar42 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar56);
          *(undefined1 (*) [16])(args.ray + 0x80) = auVar42;
        }
        if ((_DAT_01f46b40 & auVar77) != (undefined1  [16])0x0) goto LAB_0072bfcc;
        *(float *)(ray + k * 4 + 0x80) = fVar91;
        uVar25 = uVar25 ^ 1L << (uVar27 & 0x3f);
        uVar27 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
      }
      goto LAB_0072a8a7;
    }
  }
  else {
    local_7e8 = fVar157;
    fStack_7e4 = fVar159;
    fStack_7e0 = fVar161;
    fStack_7dc = fVar163;
    auVar99._0_4_ = fVar98 * fVar113 - fVar157 * fVar107;
    auVar99._4_4_ = fVar102 * fVar114 - fVar159 * fVar110;
    auVar99._8_4_ = fVar104 * fVar115 - fVar161 * fVar111;
    auVar99._12_4_ = fVar106 * fVar116 - fVar163 * fVar112;
    auVar45._4_4_ = -(uint)(ABS(fVar102 * fVar185) < ABS(fVar159 * fVar110));
    auVar45._0_4_ = -(uint)(ABS(fVar98 * fVar184) < ABS(fVar157 * fVar107));
    auVar45._8_4_ = -(uint)(ABS(fVar104 * fStack_9e0) < ABS(fVar161 * fVar111));
    auVar45._12_4_ = -(uint)(ABS(fVar106 * fStack_9dc) < ABS(fVar163 * fVar112));
    auVar18._4_4_ = fVar92 * fVar110 - fVar102 * fVar185;
    auVar18._0_4_ = fVar82 * fVar107 - fVar98 * fVar184;
    auVar18._8_4_ = fVar94 * fVar111 - fVar104 * fStack_9e0;
    auVar18._12_4_ = fVar96 * fVar112 - fVar106 * fStack_9dc;
    local_8b8 = blendvps(auVar99,auVar18,auVar45);
    auVar176._0_4_ = fVar175 * fVar107 - fVar139 * fVar113;
    auVar176._4_4_ = fVar179 * fVar110 - fVar144 * fVar114;
    auVar176._8_4_ = fVar181 * fVar111 - fVar145 * fVar115;
    auVar176._12_4_ = fVar183 * fVar112 - fVar146 * fVar116;
    auVar46._4_4_ = -(uint)(ABS(fVar101 * fVar110) < ABS(fVar144 * fVar114));
    auVar46._0_4_ = -(uint)(ABS(fVar97 * fVar107) < ABS(fVar139 * fVar113));
    auVar46._8_4_ = -(uint)(ABS(fVar103 * fVar111) < ABS(fVar145 * fVar115));
    auVar46._12_4_ = -(uint)(ABS(fVar105 * fVar112) < ABS(fVar146 * fVar116));
    auVar21._4_4_ = fVar185 * fVar144 - fVar101 * fVar110;
    auVar21._0_4_ = fVar184 * fVar139 - fVar97 * fVar107;
    auVar21._8_4_ = fStack_9e0 * fVar145 - fVar103 * fVar111;
    auVar21._12_4_ = fStack_9dc * fVar146 - fVar105 * fVar112;
    local_8a8 = blendvps(auVar176,auVar21,auVar46);
    auVar149._0_4_ = fVar97 * fVar98 - fVar139 * fVar82;
    auVar149._4_4_ = fVar101 * fVar102 - fVar144 * fVar92;
    auVar149._8_4_ = fVar103 * fVar104 - fVar145 * fVar94;
    auVar149._12_4_ = fVar105 * fVar106 - fVar146 * fVar96;
    auVar140._0_4_ = fVar139 * fVar157 - fVar175 * fVar98;
    auVar140._4_4_ = fVar144 * fVar159 - fVar179 * fVar102;
    auVar140._8_4_ = fVar145 * fVar161 - fVar181 * fVar104;
    auVar140._12_4_ = fVar146 * fVar163 - fVar183 * fVar106;
    auVar47._4_4_ = -(uint)(ABS(fVar144 * fVar92) < ABS(fVar179 * fVar102));
    auVar47._0_4_ = -(uint)(ABS(fVar139 * fVar82) < ABS(fVar175 * fVar98));
    auVar47._8_4_ = -(uint)(ABS(fVar145 * fVar94) < ABS(fVar181 * fVar104));
    auVar47._12_4_ = -(uint)(ABS(fVar146 * fVar96) < ABS(fVar183 * fVar106));
    local_898 = blendvps(auVar140,auVar149,auVar47);
    fVar57 = fVar127 * local_8b8._0_4_ + fVar119 * local_8a8._0_4_ + fVar124 * local_898._0_4_;
    fVar166 = fVar127 * local_8b8._4_4_ + fVar119 * local_8a8._4_4_ + fVar124 * local_898._4_4_;
    fVar167 = fVar127 * local_8b8._8_4_ + fVar119 * local_8a8._8_4_ + fVar124 * local_898._8_4_;
    fVar60 = fVar127 * local_8b8._12_4_ + fVar119 * local_8a8._12_4_ + fVar124 * local_898._12_4_;
    fVar57 = fVar57 + fVar57;
    fVar166 = fVar166 + fVar166;
    fVar167 = fVar167 + fVar167;
    fVar60 = fVar60 + fVar60;
    auVar67._0_4_ = fVar156 * local_8a8._0_4_ + fVar174 * local_898._0_4_;
    auVar67._4_4_ = fVar158 * local_8a8._4_4_ + fVar178 * local_898._4_4_;
    auVar67._8_4_ = fVar160 * local_8a8._8_4_ + fVar180 * local_898._8_4_;
    auVar67._12_4_ = fVar162 * local_8a8._12_4_ + fVar182 * local_898._12_4_;
    fVar123 = fVar61 * local_8b8._0_4_ + auVar67._0_4_;
    fVar131 = fVar78 * local_8b8._4_4_ + auVar67._4_4_;
    fVar132 = fVar79 * local_8b8._8_4_ + auVar67._8_4_;
    fVar126 = fVar80 * local_8b8._12_4_ + auVar67._12_4_;
    auVar19._4_4_ = fVar166;
    auVar19._0_4_ = fVar57;
    auVar19._8_4_ = fVar167;
    auVar19._12_4_ = fVar60;
    auVar64 = rcpps(auVar67,auVar19);
    fVar91 = auVar64._0_4_;
    fVar172 = auVar64._4_4_;
    fVar95 = auVar64._8_4_;
    fVar173 = auVar64._12_4_;
    local_8c8._0_4_ = ((1.0 - fVar57 * fVar91) * fVar91 + fVar91) * (fVar123 + fVar123);
    local_8c8._4_4_ = ((1.0 - fVar166 * fVar172) * fVar172 + fVar172) * (fVar131 + fVar131);
    local_8c8._8_4_ = ((1.0 - fVar167 * fVar95) * fVar95 + fVar95) * (fVar132 + fVar132);
    local_8c8._12_4_ = ((1.0 - fVar60 * fVar173) * fVar173 + fVar173) * (fVar126 + fVar126);
    fVar91 = *(float *)(ray + k * 4 + 0x80);
    fVar172 = *(float *)(ray + k * 4 + 0x30);
    auVar68._0_4_ =
         -(uint)(local_8c8._0_4_ <= fVar91 && fVar172 <= local_8c8._0_4_) & auVar121._0_4_;
    auVar68._4_4_ =
         -(uint)(local_8c8._4_4_ <= fVar91 && fVar172 <= local_8c8._4_4_) & auVar121._4_4_;
    auVar68._8_4_ =
         -(uint)(local_8c8._8_4_ <= fVar91 && fVar172 <= local_8c8._8_4_) & auVar121._8_4_;
    auVar68._12_4_ =
         -(uint)(local_8c8._12_4_ <= fVar91 && fVar172 <= local_8c8._12_4_) & auVar121._12_4_;
    iVar26 = movmskps(iVar26,auVar68);
    if ((iVar26 == 0) ||
       (auVar69._0_4_ = auVar68._0_4_ & -(uint)(fVar57 != 0.0),
       auVar69._4_4_ = auVar68._4_4_ & -(uint)(fVar166 != 0.0),
       auVar69._8_4_ = auVar68._8_4_ & -(uint)(fVar167 != 0.0),
       auVar69._12_4_ = auVar68._12_4_ & -(uint)(fVar60 != 0.0), uVar30 = movmskps(uVar23,auVar69),
       uVar30 == 0)) goto LAB_0072b464;
    uStack_ae0._0_4_ = *(uint *)(pGVar11 + 0x18);
    uStack_a30._0_4_ = *(undefined4 *)(pGVar11 + 0x1c);
    pGVar12 = (context->scene->geometries).items[(uint)uStack_ae0].ptr;
    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0072b464;
    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
       (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
      auVar64 = *(undefined1 (*) [16])local_a00;
      auVar62 = auVar64._0_12_;
      auVar42 = *(undefined1 (*) [16])(local_a00 + uVar31 * 4);
      auVar40 = auVar42._0_12_;
      if (uVar31 == 2) {
        auVar62._0_8_ = auVar64._0_8_;
        auVar62._8_4_ = auVar64._4_4_;
        auVar40._0_8_ = auVar42._0_8_;
        auVar40._8_4_ = auVar42._4_4_;
      }
      auVar64 = rcpps(auVar148,auVar86);
      fVar172 = auVar64._0_4_;
      fVar95 = auVar64._4_4_;
      fVar173 = auVar64._8_4_;
      fVar123 = auVar64._12_4_;
      fVar172 = (float)(-(uint)(1e-18 <= local_7f8) &
                       (uint)(((float)DAT_01f46a60 - auVar86._0_4_ * fVar172) * fVar172 + fVar172));
      fVar95 = (float)(-(uint)(1e-18 <= fStack_7f4) &
                      (uint)((DAT_01f46a60._4_4_ - auVar86._4_4_ * fVar95) * fVar95 + fVar95));
      fVar173 = (float)(-(uint)(1e-18 <= fStack_7f0) &
                       (uint)((DAT_01f46a60._8_4_ - auVar86._8_4_ * fVar173) * fVar173 + fVar173));
      fVar123 = (float)(-(uint)(1e-18 <= fStack_7ec) &
                       (uint)((DAT_01f46a60._12_4_ - auVar86._12_4_ * fVar123) * fVar123 + fVar123))
      ;
      auVar141._0_4_ = fVar134 * fVar172;
      auVar141._4_4_ = fVar135 * fVar95;
      auVar141._8_4_ = fVar136 * fVar173;
      auVar141._12_4_ = fVar137 * fVar123;
      auVar142 = minps(auVar141,_DAT_01f46a60);
      auVar150._0_4_ = auVar148._0_4_ * fVar172;
      auVar150._4_4_ = auVar148._4_4_ * fVar95;
      auVar150._8_4_ = auVar148._8_4_ * fVar173;
      auVar150._12_4_ = auVar148._12_4_ * fVar123;
      auVar151 = minps(auVar150,_DAT_01f46a60);
      auVar70._4_4_ = auVar62._4_4_;
      auVar88._0_8_ = auVar62._0_8_;
      auVar70._8_4_ = auVar62._8_4_;
      auVar88._8_4_ = auVar70._4_4_;
      uVar39 = auVar40._4_4_;
      auVar88._12_4_ = uVar39;
      uVar38 = auVar40._0_4_;
      auVar87._8_8_ = auVar88._8_8_;
      auVar87._0_4_ = auVar62._0_4_;
      auVar87._4_4_ = uVar38;
      auVar70._0_4_ = auVar70._4_4_;
      auVar70._12_4_ = auVar70._8_4_;
      auVar48._0_8_ = auVar40._0_8_;
      auVar48._8_4_ = uVar39;
      auVar48._12_4_ = auVar40._8_4_;
      auVar85 = pblendw(auVar87,ZEXT816(0),0xaa);
      auVar42 = pblendw(auVar70,ZEXT816(0),0xaa);
      auVar64 = pblendw(auVar48,ZEXT816(0),0xaa);
      fVar131 = auVar142._0_4_;
      fVar132 = auVar142._4_4_;
      fVar126 = auVar142._8_4_;
      fVar57 = auVar142._12_4_;
      fVar166 = auVar151._0_4_;
      fVar167 = auVar151._4_4_;
      fVar60 = auVar151._8_4_;
      fVar119 = auVar151._12_4_;
      fVar172 = ((float)DAT_01f46a60 - fVar131) - fVar166;
      fVar95 = (DAT_01f46a60._4_4_ - fVar132) - fVar167;
      fVar173 = (DAT_01f46a60._8_4_ - fVar126) - fVar60;
      fVar123 = (DAT_01f46a60._12_4_ - fVar57) - fVar119;
      local_8e8._0_4_ =
           (float)auVar85._0_4_ * 0.00012207031 * fVar172 +
           (float)auVar64._0_4_ * 0.00012207031 * fVar166 +
           (float)auVar42._0_4_ * 0.00012207031 * fVar131;
      local_8e8._4_4_ =
           (float)auVar85._4_4_ * 0.00012207031 * fVar95 +
           (float)auVar64._4_4_ * 0.00012207031 * fVar167 +
           (float)auVar42._4_4_ * 0.00012207031 * fVar132;
      local_8e8._8_4_ =
           (float)auVar85._8_4_ * 0.00012207031 * fVar173 +
           (float)auVar64._8_4_ * 0.00012207031 * fVar60 +
           (float)auVar42._8_4_ * 0.00012207031 * fVar126;
      local_8e8._12_4_ =
           (float)auVar85._12_4_ * 0.00012207031 * fVar123 +
           (float)auVar64._12_4_ * 0.00012207031 * fVar119 +
           (float)auVar42._12_4_ * 0.00012207031 * fVar57;
      local_8d8._0_4_ =
           fVar172 * (float)(auVar87._0_4_ >> 0x10) * 0.00012207031 +
           (float)(uVar38 >> 0x10) * 0.00012207031 * fVar166 +
           (float)(auVar70._4_4_ >> 0x10) * 0.00012207031 * fVar131;
      local_8d8._4_4_ =
           fVar95 * (float)(uVar38 >> 0x10) * 0.00012207031 +
           (float)(uVar39 >> 0x10) * 0.00012207031 * fVar167 +
           (float)(auVar70._4_4_ >> 0x10) * 0.00012207031 * fVar132;
      local_8d8._8_4_ =
           fVar173 * (float)(auVar70._4_4_ >> 0x10) * 0.00012207031 +
           (float)(uVar39 >> 0x10) * 0.00012207031 * fVar60 +
           (float)(auVar70._8_4_ >> 0x10) * 0.00012207031 * fVar126;
      local_8d8._12_4_ =
           fVar123 * (float)(uVar39 >> 0x10) * 0.00012207031 +
           (float)(auVar40._8_4_ >> 0x10) * 0.00012207031 * fVar119 +
           (float)(auVar70._8_4_ >> 0x10) * 0.00012207031 * fVar57;
      uVar25 = (ulong)(uVar30 & 0xff);
      uVar27 = 0;
      if (uVar25 != 0) {
        for (; ((uVar30 & 0xff) >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      local_ae8 = CONCAT44((uint)uStack_ae0,(uint)uStack_ae0);
      uStack_ae0._4_4_ = (uint)uStack_ae0;
      _old_t_1 = CONCAT44((undefined4)uStack_a30,(undefined4)uStack_a30);
      uStack_a30._4_4_ = (undefined4)uStack_a30;
      auVar64 = *local_9d0;
      local_9f8 = uVar31;
      local_9f0 = (ulong)uVar23;
      local_9e8 = pGVar29;
      while (uVar25 != 0) {
        local_858 = *(undefined4 *)(local_8e8 + uVar27 * 4);
        uVar9 = *(undefined4 *)(local_8d8 + uVar27 * 4);
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8c8 + uVar27 * 4);
        args.context = context->user;
        local_848._4_4_ = uVar9;
        local_848._0_4_ = uVar9;
        local_848._8_4_ = uVar9;
        local_848._12_4_ = uVar9;
        local_888 = *(undefined4 *)(local_8b8 + uVar27 * 4);
        local_878 = *(undefined4 *)(local_8a8 + uVar27 * 4);
        local_868 = *(undefined4 *)(local_898 + uVar27 * 4);
        uStack_884 = local_888;
        uStack_880 = local_888;
        uStack_87c = local_888;
        uStack_874 = local_878;
        uStack_870 = local_878;
        uStack_86c = local_878;
        uStack_864 = local_868;
        uStack_860 = local_868;
        uStack_85c = local_868;
        uStack_854 = local_858;
        uStack_850 = local_858;
        uStack_84c = local_858;
        local_838 = _old_t_1;
        uStack_830 = uStack_a30;
        local_828 = local_ae8;
        uStack_820 = uStack_ae0;
        local_818 = (args.context)->instID[0];
        uStack_814 = local_818;
        uStack_810 = local_818;
        uStack_80c = local_818;
        local_808 = (args.context)->instPrimID[0];
        uStack_804 = local_808;
        uStack_800 = local_808;
        uStack_7fc = local_808;
        args.valid = (int *)local_a18;
        args.geometryUserPtr = pGVar12->userPtr;
        args.hit = (RTCHitN *)&local_888;
        args.N = 4;
        local_a18 = auVar64;
        args.ray = (RTCRayN *)ray;
        if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
          (*pGVar12->occlusionFilterN)(&args);
          pGVar29 = local_9e8;
        }
        if (local_a18 == (undefined1  [16])0x0) {
          auVar71._8_4_ = 0xffffffff;
          auVar71._0_8_ = 0xffffffffffffffff;
          auVar71._12_4_ = 0xffffffff;
          auVar71 = auVar71 ^ _DAT_01f46b70;
        }
        else {
          p_Var13 = context->args->filter;
          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
            (*p_Var13)(&args);
            pGVar29 = local_9e8;
          }
          auVar49._0_4_ = -(uint)(local_a18._0_4_ == 0);
          auVar49._4_4_ = -(uint)(local_a18._4_4_ == 0);
          auVar49._8_4_ = -(uint)(local_a18._8_4_ == 0);
          auVar49._12_4_ = -(uint)(local_a18._12_4_ == 0);
          auVar71 = auVar49 ^ _DAT_01f46b70;
          auVar42 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar49);
          *(undefined1 (*) [16])(args.ray + 0x80) = auVar42;
        }
        if ((_DAT_01f46b40 & auVar71) != (undefined1  [16])0x0) goto LAB_0072bfcc;
        *(float *)(ray + k * 4 + 0x80) = fVar91;
        uVar25 = uVar25 ^ 1L << (uVar27 & 0x3f);
        uVar27 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
      }
      goto LAB_0072b464;
    }
  }
LAB_0072bfcc:
  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
  goto LAB_0072bfd8;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }